

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O3

void io::detail::parse_line<io::trim_chars<(char)32,(char)9>,io::no_quote_escape<(char)44>>
               (char *line,char **sorted_col,vector<int,_std::allocator<int>_> *col_order)

{
  pointer piVar1;
  undefined8 *__s;
  pointer_____offset_0x10___ *ppuVar2;
  ulong uVar3;
  char *local_48;
  char *col_end;
  char *line_local;
  char *col_begin;
  
  col_end = line;
  if ((col_order->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (col_order->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar3 = 0;
    do {
      if (col_end == (char *)0x0) {
        __s = (undefined8 *)__cxa_allocate_exception(0x210);
        memset(__s,0,0x210);
        *(undefined4 *)(__s + 0x41) = 0xffffffff;
        *__s = &PTR__exception_00120aa8;
        ppuVar2 = &error::too_few_columns::typeinfo;
        goto LAB_001160e9;
      }
      chop_next_column<io::no_quote_escape<(char)44>>(&col_end,&line_local,&local_48);
      piVar1 = (col_order->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar1[uVar3] != -1) {
        for (; ((*line_local == '\t' || (*line_local == ' ')) && (line_local != local_48));
            line_local = line_local + 1) {
        }
        for (; ((local_48[-1] == ' ' || (local_48[-1] == '\t')) && (local_48 != line_local));
            local_48 = local_48 + -1) {
        }
        *local_48 = '\0';
        sorted_col
        [(col_order->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start[uVar3]] = line_local;
        piVar1 = (col_order->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)(col_order->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar1 >> 2));
  }
  if (col_end == (char *)0x0) {
    return;
  }
  __s = (undefined8 *)__cxa_allocate_exception(0x210);
  memset(__s,0,0x210);
  *(undefined4 *)(__s + 0x41) = 0xffffffff;
  *__s = &PTR__exception_00120ad8;
  ppuVar2 = &error::too_many_columns::typeinfo;
LAB_001160e9:
  __cxa_throw(__s,ppuVar2,std::exception::~exception);
}

Assistant:

void parse_line(
                        char*line,
                        char**sorted_col,
                        const std::vector<int>&col_order
                ){
                        for(std::size_t i=0; i<col_order.size(); ++i){
                                if(line == nullptr)
                                        throw ::io::error::too_few_columns();
                                char*col_begin, *col_end;
                                chop_next_column<quote_policy>(line, col_begin, col_end);

                                if(col_order[i] != -1){
                                        trim_policy::trim(col_begin, col_end);
                                        quote_policy::unescape(col_begin, col_end);
                                                               
                                        sorted_col[col_order[i]] = col_begin;
                                }
                        }
                        if(line != nullptr)
                                throw ::io::error::too_many_columns();
                }